

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::find_child_by_attribute(xml_node *this,char_t *attr_name,char_t *attr_value)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  bool bVar3;
  xml_node_struct **ppxVar4;
  char_t *dst;
  xml_attribute_struct **ppxVar5;
  
  if (this->_root != (xml_node_struct *)0x0) {
    ppxVar4 = &this->_root->first_child;
    while (pxVar1 = *ppxVar4, pxVar1 != (xml_node_struct *)0x0) {
      ppxVar5 = &pxVar1->first_attribute;
      while (pxVar2 = *ppxVar5, pxVar2 != (xml_attribute_struct *)0x0) {
        if ((pxVar2->name != (char_t *)0x0) &&
           (bVar3 = impl::anon_unknown_0::strequal(attr_name,pxVar2->name), bVar3)) {
          dst = pxVar2->value;
          if (dst == (char_t *)0x0) {
            dst = "";
          }
          bVar3 = impl::anon_unknown_0::strequal(attr_value,dst);
          if (bVar3) {
            return (xml_node)pxVar1;
          }
        }
        ppxVar5 = &pxVar2->next_attribute;
      }
      ppxVar4 = &pxVar1->next_sibling;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::find_child_by_attribute(const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
			{
				const char_t* aname = a->name;
				if (aname && impl::strequal(attr_name, aname))
				{
					const char_t* avalue = a->value;
					if (impl::strequal(attr_value, avalue ? avalue : PUGIXML_TEXT("")))
						return xml_node(i);
				}
			}

		return xml_node();
	}